

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void init::LogPackageVersion(void)

{
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  string version_string;
  _Alloc_hider in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  FormatFullVersion_abi_cxx11_();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffd0," (release build)");
  logging_function._M_str = "LogPackageVersion";
  logging_function._M_len = 0x11;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/init/common.cpp";
  source_file._M_len = 0x58;
  ::LogPrintf_<std::__cxx11::string>
            (logging_function,source_file,0x95,
             IPC|QT|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|ESTIMATEFEE|WALLETDB|ZMQ|BENCH|
             MEMPOOL|NET,
             (Level)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xffffffffffffffd0,in_stack_ffffffffffffffd0._M_p,
             in_stack_ffffffffffffffd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffffd0._M_p != &local_20) {
    operator_delete(in_stack_ffffffffffffffd0._M_p,local_20._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LogPackageVersion()
{
    std::string version_string = FormatFullVersion();
#ifdef DEBUG
    version_string += " (debug build)";
#else
    version_string += " (release build)";
#endif
    LogPrintf(PACKAGE_NAME " version %s\n", version_string);
}